

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O3

compile_errcode __thiscall
ValueArgumentList::Action
          (ValueArgumentList *this,vector<_SymbolType,_std::allocator<_SymbolType>_> *argument_type)

{
  iterator __position;
  SymbolName SVar1;
  compile_errcode cVar2;
  undefined8 in_RAX;
  int iVar3;
  SymbolType expression_type;
  undefined8 uStack_28;
  
  iVar3 = 0;
  uStack_28 = in_RAX;
LAB_0012f72c:
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (iVar3 != 2) {
      if (iVar3 == 1) {
        if (SVar1 != COMMA_SYM) {
          return 0;
        }
        SymbolQueue::NextSymbol(handle_correct_queue);
        iVar3 = 2;
        goto LAB_0012f72c;
      }
      if (SVar1 == R_CIRCLE_BRACKET_SYM) {
        return 0;
      }
    }
    cVar2 = Expression::Action(&this->m_expression,(SymbolType *)((long)&uStack_28 + 4));
    if (cVar2 != 0) {
      return -1;
    }
    __position._M_current =
         (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<_SymbolType,std::allocator<_SymbolType>>::_M_realloc_insert<_SymbolType_const&>
                ((vector<_SymbolType,std::allocator<_SymbolType>> *)argument_type,__position,
                 (SymbolType *)((long)&uStack_28 + 4));
      iVar3 = 1;
    }
    else {
      *__position._M_current = uStack_28._4_4_;
      (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
      iVar3 = 1;
    }
  } while( true );
}

Assistant:

compile_errcode ValueArgumentList::Action(vector<SymbolType>& argument_type) {
    int ret = COMPILE_OK;
    int state = 0;
    SymbolType expression_type;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    return COMPILE_OK;
                } else if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    argument_type.push_back(expression_type);
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == COMMA_SYM) {
                    state = 2;
                    break;
                } else {
                    return COMPILE_OK;
                }
            }
            case 2: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    argument_type.push_back(expression_type);
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
        }
        if (state != 1)
            handle_correct_queue->NextSymbol();
    }
}